

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackRecordVariableSelectionCase::iterate
          (FeedbackRecordVariableSelectionCase *this)

{
  code *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestError *pTVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  long lVar10;
  Vector<float,_4> *local_640;
  MessageBuilder local_5c8;
  Vector<float,_4> local_444;
  Vector<float,_4> local_434;
  Vector<float,_4> local_424;
  Vector<float,_4> local_414;
  Vector<bool,_4> local_404;
  int local_400;
  undefined1 local_3fa;
  allocator<char> local_3f9;
  int ndx;
  undefined1 local_3d2;
  allocator<char> local_3d1;
  string local_3d0;
  void *local_3b0;
  void *mapPtr;
  Vec4 feedbackValues [3];
  MessageBuilder local_370;
  MessageBuilder local_1f0;
  undefined1 local_6d;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  VertexArray vao;
  int posLoc;
  Functions *gl;
  FeedbackRecordVariableSelectionCase *this_local;
  
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar4);
  pcVar1 = *(code **)(lVar10 + 0x780);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  vao.super_ObjectWrapper._20_4_ = (*pcVar1)(dVar5,"a_position");
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_38,pRVar6);
  if (vao.super_ObjectWrapper._20_4_ == -1) {
    local_6d = 1;
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"a_position attribute location was -1",&local_59);
    tcu::TestError::TestError(pTVar7,&local_58);
    local_6d = 0;
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1f0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_1f0,(char (*) [29])"Rendering a patch of size 3.")
  ;
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1f0);
  (**(code **)(lVar10 + 0x1a00))(0,0,1);
  (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar10 + 0x188))(0x4000);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb5f);
  pcVar1 = *(code **)(lVar10 + 0xd8);
  dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_38);
  (*pcVar1)(dVar5);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"bindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb62);
  (**(code **)(lVar10 + 0x1858))(0,0,0,0x3f800000,vao.super_ObjectWrapper._20_4_);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"vertexAttrib4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb65);
  pcVar1 = *(code **)(lVar10 + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  (*pcVar1)(dVar5);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb68);
  (**(code **)(lVar10 + 0xfd8))(0x8e72,3);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"set patch param",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb6b);
  (**(code **)(lVar10 + 0x48))(0x8c8e,0,this->m_xfbBuf);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"bind xfb buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb6e);
  (**(code **)(lVar10 + 0x30))(4);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"beginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb71);
  (**(code **)(lVar10 + 0x538))(0xe,0,3);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb74);
  (**(code **)(lVar10 + 0x638))();
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"beginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb77);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_370,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<
                     (&local_370,
                      (char (*) [93])
                      "Verifying the value of tf_feedback using transform feedback, expecting (3.0, 3.0, 3.0, 3.0)."
                     );
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_370);
  local_640 = (Vector<float,_4> *)&mapPtr;
  do {
    tcu::Vector<float,_4>::Vector(local_640);
    local_640 = local_640 + 1;
  } while (local_640 != (Vector<float,_4> *)(feedbackValues[2].m_data + 2));
  local_3b0 = (void *)(**(code **)(lVar10 + 0xd00))(0x8c8e,0,0x30,1);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"mapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb7f);
  if (local_3b0 != (void *)0x0) {
    ::deMemcpy(&mapPtr,local_3b0,0x30);
    cVar2 = (**(code **)(lVar10 + 0x1670))(0x8c8e);
    if (cVar2 == '\x01') {
      for (local_400 = 0; local_400 < 3; local_400 = local_400 + 1) {
        lVar10 = (long)local_400;
        tcu::Vector<float,_4>::Vector(&local_434,3.0);
        tcu::operator-((tcu *)&local_424,
                       (Vector<float,_4> *)(feedbackValues[lVar10 + -1].m_data + 2),&local_434);
        tcu::abs<float,4>((tcu *)&local_414,&local_424);
        tcu::Vector<float,_4>::Vector(&local_444,0.001);
        tcu::lessThan<float,4>((tcu *)&local_404,&local_414,&local_444);
        bVar3 = tcu::boolAll<4>(&local_404);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          pTVar8 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_5c8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<(&local_5c8,(char (*) [17])"Feedback vertex ");
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_400);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(char (*) [38])": expected (3.0, 3.0, 3.0, 3.0), got ");
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(Vector<float,_4> *)
                                     (feedbackValues[(long)local_400 + -1].m_data + 2));
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_5c8);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"got unexpected feedback results");
        }
      }
      glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)5> *)local_38);
      return STOP;
    }
    local_3fa = 1;
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ndx,"unmapBuffer did not return TRUE",&local_3f9);
    tcu::TestError::TestError(pTVar7,(string *)&ndx);
    local_3fa = 0;
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  local_3d2 = 1;
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"mapBufferRange returned null",&local_3d1);
  tcu::TestError::TestError(pTVar7,&local_3d0);
  local_3d2 = 0;
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

FeedbackRecordVariableSelectionCase::IterateResult FeedbackRecordVariableSelectionCase::iterate (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	const int				posLoc	= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const glu::VertexArray	vao		(m_context.getRenderContext());

	if (posLoc == -1)
		throw tcu::TestError("a_position attribute location was -1");

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering a patch of size 3." << tcu::TestLog::EndMessage;

	// Render and feed back

	gl.viewport(0, 0, 1, 1);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

	gl.bindVertexArray(*vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bindVertexArray");

	gl.vertexAttrib4f(posLoc, 0.0f, 0.0f, 0.0f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "vertexAttrib4f");

	gl.useProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "use program");

	gl.patchParameteri(GL_PATCH_VERTICES, 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set patch param");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_xfbBuf);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind xfb buf");

	gl.beginTransformFeedback(GL_TRIANGLES);
	GLU_EXPECT_NO_ERROR(gl.getError(), "beginTransformFeedback");

	gl.drawArrays(GL_PATCHES, 0, 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "drawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "beginTransformFeedback");

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying the value of tf_feedback using transform feedback, expecting (3.0, 3.0, 3.0, 3.0)." << tcu::TestLog::EndMessage;

	// Read back result (one triangle)
	{
		tcu::Vec4	feedbackValues[3];
		const void* mapPtr				= gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, (int)sizeof(feedbackValues), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "mapBufferRange");

		if (mapPtr == DE_NULL)
			throw tcu::TestError("mapBufferRange returned null");

		deMemcpy(feedbackValues, mapPtr, sizeof(feedbackValues));

		if (gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER) != GL_TRUE)
			throw tcu::TestError("unmapBuffer did not return TRUE");

		for (int ndx = 0; ndx < 3; ++ndx)
		{
			if (!tcu::boolAll(tcu::lessThan(tcu::abs(feedbackValues[ndx] - tcu::Vec4(3.0f)), tcu::Vec4(0.001f))))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Feedback vertex " << ndx << ": expected (3.0, 3.0, 3.0, 3.0), got " << feedbackValues[ndx] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected feedback results");
			}
		}
	}

	return STOP;
}